

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O0

size_t interpretBase(OPTYPE *pMyOperand,size_t i,PDISASM pMyDisasm)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t j;
  PDISASM pMyDisasm_local;
  size_t i_local;
  OPTYPE *pMyOperand_local;
  
  if (((pMyDisasm->Reserved_).BASE_ == 5) && ((pMyDisasm->Reserved_).MOD_ == 0)) {
    (pMyDisasm->Reserved_).DECALAGE_EIP = (pMyDisasm->Reserved_).DECALAGE_EIP + 4;
    iVar1 = Security(7,pMyDisasm);
    if (iVar1 == 0) {
      return i;
    }
    sVar2 = CopyFormattedNumber(pMyDisasm,pMyOperand->OpMnemonic + i,"%.8X",
                                (ulong)*(uint *)((pMyDisasm->Reserved_).EIP_ + 3));
    pMyDisasm_local = (PDISASM)(sVar2 + i);
    (pMyOperand->Memory).Displacement = (ulong)*(uint *)((pMyDisasm->Reserved_).EIP_ + 3);
  }
  else {
    pMyDisasm_local = (PDISASM)i;
    if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
      strcpy(pMyOperand->OpMnemonic + i,"(%");
      pMyDisasm_local = (PDISASM)(i + 2);
    }
    if ((pMyDisasm->Reserved_).AddressSize == 0x40) {
      if ((pMyDisasm->Reserved_).REX.B_ == '\0') {
        strcpy(pMyDisasm_local->CompleteInstr + (long)pMyOperand->OpMnemonic + -0x14,
               Registers64Bits[(pMyDisasm->Reserved_).BASE_]);
        (pMyOperand->Memory).BaseRegister = REGS[(pMyDisasm->Reserved_).BASE_];
        sVar3 = strlen(Registers64Bits[(pMyDisasm->Reserved_).BASE_]);
      }
      else {
        strcpy(pMyDisasm_local->CompleteInstr + (long)pMyOperand->OpMnemonic + -0x14,
               Registers64Bits[(pMyDisasm->Reserved_).BASE_ + 8]);
        (pMyOperand->Memory).BaseRegister = REGS[(pMyDisasm->Reserved_).BASE_ + 8];
        sVar3 = strlen(Registers64Bits[(pMyDisasm->Reserved_).BASE_ + 8]);
      }
      pMyDisasm_local = (PDISASM)(pMyDisasm_local->CompleteInstr + (sVar3 - 0x14));
    }
    else if ((pMyDisasm->Reserved_).AddressSize == 0x20) {
      if ((pMyDisasm->Reserved_).REX.B_ == '\0') {
        strcpy(pMyDisasm_local->CompleteInstr + (long)pMyOperand->OpMnemonic + -0x14,
               Registers32Bits[(pMyDisasm->Reserved_).BASE_]);
        (pMyOperand->Memory).BaseRegister = REGS[(pMyDisasm->Reserved_).BASE_];
        sVar3 = strlen(Registers32Bits[(pMyDisasm->Reserved_).BASE_]);
      }
      else {
        strcpy(pMyDisasm_local->CompleteInstr + (long)pMyOperand->OpMnemonic + -0x14,
               Registers32Bits[(pMyDisasm->Reserved_).BASE_ + 8]);
        (pMyOperand->Memory).BaseRegister = REGS[(pMyDisasm->Reserved_).BASE_ + 8];
        sVar3 = strlen(Registers32Bits[(pMyDisasm->Reserved_).BASE_ + 8]);
      }
      pMyDisasm_local = (PDISASM)(pMyDisasm_local->CompleteInstr + (sVar3 - 0x14));
    }
  }
  return (size_t)pMyDisasm_local;
}

Assistant:

size_t __bea_callspec__ interpretBase(OPTYPE* pMyOperand, size_t i, PDISASM pMyDisasm)
{
  size_t j;
  if ((GV.BASE_  == 5) && (GV.MOD_ == 0)) {
    GV.DECALAGE_EIP += 4;
    if (!Security(7, pMyDisasm)) return i;
    j = i;
    #ifndef BEA_LIGHT_DISASSEMBLY
       i+= CopyFormattedNumber(pMyDisasm, (char*) pMyOperand->OpMnemonic+j,"%.8X",(Int64) *((UInt32*) (GV.EIP_+3)));
    #endif
    pMyOperand->Memory.Displacement = *((UInt32*) (GV.EIP_+3));
  }
  else {
    if (GV.SYNTAX_ == ATSyntax) {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy((char*) pMyOperand->OpMnemonic+i, "(%");
      #endif
      i += 2;
    }
    if (GV.AddressSize == 64) {
      if (GV.REX.B_ == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy((char*) pMyOperand->OpMnemonic+i, Registers64Bits[GV.BASE_ ]);
        #endif
        pMyOperand->Memory.BaseRegister = REGS[GV.BASE_ ];
        i += strlen(Registers64Bits[GV.BASE_ ]);
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy((char*) pMyOperand->OpMnemonic+i, Registers64Bits[GV.BASE_ +8]);
        #endif
        pMyOperand->Memory.BaseRegister = REGS[GV.BASE_ +8];
        i += strlen( Registers64Bits[GV.BASE_ +8]);
      }
    }
    else if (GV.AddressSize == 32) {
      if (GV.REX.B_ == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy((char*) pMyOperand->OpMnemonic+i, Registers32Bits[GV.BASE_ ]);
        #endif
        pMyOperand->Memory.BaseRegister = REGS[GV.BASE_ ];
        i += strlen( Registers32Bits[GV.BASE_ ]);
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy((char*) pMyOperand->OpMnemonic+i, Registers32Bits[GV.BASE_ +8]);
        #endif
        pMyOperand->Memory.BaseRegister = REGS[GV.BASE_ +8];
        i += strlen( Registers32Bits[GV.BASE_ +8]);
      }
    }
  }
  return i;
}